

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturmchain.h
# Opt level: O2

int __thiscall gmath::SturmChain<double>::countSignChangesNegInf(SturmChain<double> *this)

{
  Polynomial<double> *pPVar1;
  int iVar2;
  double **ppdVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  pPVar1 = this->f;
  dVar5 = pPVar1->c[(long)pPVar1->used + -1];
  if (((long)pPVar1->used - 1U & 1) != 0) {
    dVar5 = -dVar5;
  }
  ppdVar3 = &pPVar1[1].c;
  iVar2 = 0;
  for (lVar4 = 1; lVar4 < this->n; lVar4 = lVar4 + 1) {
    dVar6 = (*ppdVar3)[(long)*(int *)((long)ppdVar3 + -4) + -1];
    if (((long)*(int *)((long)ppdVar3 + -4) - 1U & 1) != 0) {
      dVar6 = -dVar6;
    }
    if (((dVar5 < 0.0) && (0.0 <= dVar6)) || ((0.0 <= dVar5 && (dVar6 < 0.0)))) {
      iVar2 = iVar2 + 1;
    }
    ppdVar3 = ppdVar3 + 2;
    dVar5 = dVar6;
  }
  return iVar2;
}

Assistant:

int countSignChangesNegInf() const
    {
      double f1;
      int    ret=0;

      // the sign of the highest coefficient, multiplied by -1 if the degree
      // is odd has the same sign as the limes at negative infinity

      f1=f[0][f[0].getDegree()];

      if ((f[0].getDegree() & 0x1) != 0)
      {
        f1*=-1;
      }

      for (int k=1; k<n; k++)
      {
        double f2=f[k][f[k].getDegree()];

        if ((f[k].getDegree() & 0x1) != 0)
        {
          f2*=-1;
        }

        if ((f1 < 0 && f2 >= 0) || (f1 >= 0 && f2 < 0))
        {
          ret++;
        }

        f1=f2;
      }

      return ret;
    }